

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

set_icase *
get_script_dependencies
          (set_icase *__return_storage_ptr__,string *fname,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *searchedScripts,set_icase *hud_files)

{
  pointer *ppbVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  istream *piVar8;
  iterator __first;
  iterator __last;
  long lVar9;
  size_type sVar10;
  reference pvVar11;
  double dVar12;
  string *local_12f0;
  string *local_12d8;
  bool local_12c8;
  bool local_12c5;
  bool local_12c2;
  bool local_128a;
  bool local_1286;
  bool local_1282;
  string local_11e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11a8 [32];
  string local_1188 [32];
  string local_1168 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1148 [8];
  string spr;
  string local_1128 [32];
  undefined1 local_1108 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string local_10d0 [32];
  string local_10b0 [32];
  string local_1090 [32];
  string local_1070 [32];
  long local_1050;
  size_t cpos;
  string line_1;
  istream local_1020 [3];
  bool in_func_body;
  int lineNum_1;
  ifstream file;
  string local_e18 [8];
  string hud_path;
  string local_df8 [32];
  string local_dd8 [32];
  string local_db8 [32];
  string local_d98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d38 [8];
  string hud_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d18 [32];
  string local_cf8 [32];
  string local_cd8 [32];
  string local_cb8 [32];
  undefined1 local_c98 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ret2;
  string local_c60 [32];
  string local_c40 [32];
  undefined1 local_c20 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ret1;
  string local_be8 [8];
  string arg2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bc8 [36];
  int local_ba4;
  string local_ba0 [4];
  int comma2;
  string local_b80 [32];
  string local_b60 [8];
  string arg1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b40 [32];
  int local_b20;
  allocator local_b19;
  int comma;
  string local_af8 [32];
  __cxx11 local_ad8 [32];
  string local_ab8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a58 [8];
  string err;
  string local_a38 [32];
  string local_a18 [32];
  string local_9f8 [36];
  int local_9d4;
  string local_9d0 [4];
  int k;
  string local_9b0 [32];
  string local_990 [8];
  string valpath_1;
  string local_970 [32];
  string local_950 [32];
  string local_930 [32];
  string local_910 [32];
  string local_8f0 [32];
  string local_8d0 [8];
  string valpath;
  string local_8b0 [32];
  string local_890 [32];
  string local_870 [32];
  string local_850 [32];
  string local_830 [32];
  string local_810 [32];
  string local_7f0 [32];
  string local_7d0 [32];
  string local_7b0 [32];
  int local_790;
  allocator local_789;
  int i;
  string concatVal;
  string local_768 [39];
  bool local_741;
  string local_740 [7];
  bool spriteValExists;
  bool local_719;
  string local_718 [7];
  bool soundValExists;
  bool local_6f1;
  string local_6f0 [7];
  bool valExists;
  string sprite_val;
  string local_6d0 [8];
  string sound_val;
  string local_6b0 [32];
  string local_690 [8];
  string tmpVal;
  string local_668 [32];
  string local_648 [32];
  string local_628 [8];
  string ext;
  string local_608 [8];
  string val;
  string local_5e8 [32];
  undefined1 local_5c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  string s;
  string local_580 [32];
  undefined1 local_560 [8];
  set_icase includeRes;
  _Self local_500;
  _Self local_4f8;
  string local_4f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0 [32];
  string local_490 [8];
  string include;
  string local_470 [32];
  string local_450 [32];
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0 [32];
  long local_390;
  size_t commentEnd;
  size_t commentStart;
  string local_360 [32];
  string local_340 [8];
  string line;
  int local_31c;
  istream local_318 [3];
  bool inCommentBlock;
  int lineNum;
  ifstream myfile;
  string local_110 [8];
  string trace;
  string local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [36];
  int local_ac;
  string local_a8 [4];
  int idir;
  string local_88 [35];
  byte local_65;
  bool isWeaponCustom;
  allocator local_51;
  string local_50 [8];
  string folder;
  set_icase *hud_files_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *searchedScripts_local;
  string *fname_local;
  set_icase *resources;
  
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_InsensitiveCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"scripts/maps/",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::__cxx11::string::string(local_a8,(string *)fname);
  toLowerCase(local_88);
  lVar5 = std::__cxx11::string::find((char *)local_88,0x15c74b);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string(local_a8);
  local_65 = lVar5 != -1;
  local_ac = std::__cxx11::string::find_last_of((char *)fname,0x15c058);
  if ((local_ac != -1) &&
     (uVar6 = (ulong)local_ac, uVar7 = std::__cxx11::string::length(), uVar7 < uVar6)) {
    std::__cxx11::string::substr((ulong)local_f0,(ulong)fname);
    std::operator+(local_d0,(char)local_f0);
    std::__cxx11::string::operator=(local_50,(string *)local_d0);
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string(local_f0);
  }
  contentExists(fname,true,(string *)dummy_abi_cxx11_);
  std::__cxx11::string::string(local_110,(string *)fname);
  std::ifstream::ifstream(local_318,(string *)fname,_S_in);
  bVar3 = std::ifstream::is_open();
  if ((bVar3 & 1) != 0) {
    local_31c = 0;
    bVar2 = false;
    std::__cxx11::string::string(local_340);
LAB_00152343:
    do {
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_318,local_340);
      bVar4 = std::ios::operator_cast_to_bool((ios *)(piVar8 + *(long *)(*(long *)piVar8 + -0x18)));
      if (!bVar4) goto LAB_00154934;
      local_31c = local_31c + 1;
      std::__cxx11::string::string((string *)&commentStart,local_340);
      trimSpaces(local_360);
      std::__cxx11::string::operator=(local_340,(string *)local_360);
      std::__cxx11::string::~string((string *)local_360);
      std::__cxx11::string::~string((string *)&commentStart);
      lVar5 = std::__cxx11::string::find((char *)local_340,0x15b1fa);
      if (lVar5 != 0) {
        commentEnd = std::__cxx11::string::find((char *)local_340,0x15c75c);
        local_390 = std::__cxx11::string::find((char *)local_340,0x15c75f);
        while (commentEnd != 0xffffffffffffffff && local_390 != -1) {
          std::__cxx11::string::substr((ulong)local_3d0,(ulong)local_340);
          std::__cxx11::string::substr((ulong)local_3f0,(ulong)local_340);
          std::operator+(local_3b0,local_3d0);
          std::__cxx11::string::operator=(local_340,(string *)local_3b0);
          std::__cxx11::string::~string((string *)local_3b0);
          std::__cxx11::string::~string(local_3f0);
          std::__cxx11::string::~string((string *)local_3d0);
          commentEnd = std::__cxx11::string::find((char *)local_340,0x15c75c);
          local_390 = std::__cxx11::string::find((char *)local_340,0x15c75f);
        }
        if (bVar2) {
          if (local_390 == -1) goto LAB_00152343;
          bVar2 = false;
          std::__cxx11::string::substr((ulong)local_410,(ulong)local_340);
          std::__cxx11::string::operator=(local_340,local_410);
          std::__cxx11::string::~string(local_410);
          local_390 = -1;
          commentEnd = 0xffffffffffffffff;
        }
        else if (commentEnd != 0xffffffffffffffff) {
          std::__cxx11::string::substr((ulong)local_430,(ulong)local_340);
          std::__cxx11::string::operator=(local_340,local_430);
          std::__cxx11::string::~string(local_430);
          bVar2 = true;
        }
        std::__cxx11::string::string(local_470,local_340);
        replaceChar(local_450,(char)local_470,'\t');
        std::__cxx11::string::operator=(local_340,(string *)local_450);
        std::__cxx11::string::~string((string *)local_450);
        std::__cxx11::string::~string(local_470);
        lVar5 = std::__cxx11::string::find((char *)local_340,0x15c762);
        if (lVar5 == 0) {
          readQuote(local_4f0);
          std::operator+(local_4d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_50);
          std::operator+(local_4b0,(char *)local_4d0);
          normalize_path(local_490,SUB81(local_4b0,0));
          std::__cxx11::string::~string((string *)local_4b0);
          std::__cxx11::string::~string((string *)local_4d0);
          std::__cxx11::string::~string((string *)local_4f0);
          local_4f8._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(searchedScripts,local_490);
          local_500._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(searchedScripts);
          bVar4 = std::operator==(&local_4f8,&local_500);
          if (bVar4) {
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(searchedScripts,local_490);
            std::__cxx11::string::string
                      ((string *)&includeRes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (string *)local_490);
            push_unique(__return_storage_ptr__,
                        (string *)&includeRes._M_t._M_impl.super__Rb_tree_header._M_node_count);
            std::__cxx11::string::~string
                      ((string *)&includeRes._M_t._M_impl.super__Rb_tree_header._M_node_count);
            std::__cxx11::string::string(local_580,(string *)local_490);
            get_script_dependencies
                      ((set_icase *)local_560,(string *)local_580,searchedScripts,hud_files);
            std::__cxx11::string::~string(local_580);
            __first = std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_InsensitiveCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_InsensitiveCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_560);
            __last = std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_InsensitiveCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_InsensitiveCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_560);
            std::set<std::__cxx11::string,InsensitiveCompare,std::allocator<std::__cxx11::string>>::
            insert<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                      ((set<std::__cxx11::string,InsensitiveCompare,std::allocator<std::__cxx11::string>>
                        *)__return_storage_ptr__,
                       (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )__first._M_node,
                       (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )__last._M_node);
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_InsensitiveCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_InsensitiveCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_560);
          }
          std::__cxx11::string::~string((string *)local_490);
        }
        if ((local_65 & 1) == 0) {
          std::__cxx11::string::string
                    ((string *)
                     &values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,local_340);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_5c8);
          while (lVar5 = std::__cxx11::string::length(), lVar5 != 0) {
            uVar6 = std::__cxx11::string::find
                              ((char *)&values.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,0x15b8aa)
            ;
            lVar5 = std::__cxx11::string::length();
            if (lVar5 - 1U <= uVar6) break;
            ppbVar1 = &values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::__cxx11::string::find((char *)ppbVar1,0x15b8aa);
            std::__cxx11::string::substr((ulong)local_5e8,(ulong)ppbVar1);
            std::__cxx11::string::operator=
                      ((string *)
                       &values.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,local_5e8);
            std::__cxx11::string::~string(local_5e8);
            lVar5 = std::__cxx11::string::find
                              ((char *)&values.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,0x15b8aa)
            ;
            if (lVar5 == -1) break;
            ppbVar1 = &values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::__cxx11::string::find((char *)ppbVar1,0x15b8aa);
            std::__cxx11::string::substr((ulong)local_608,(ulong)ppbVar1);
            std::__cxx11::string::string(local_648,local_608);
            get_ext(local_628);
            std::__cxx11::string::~string(local_648);
            ppbVar1 = &values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::__cxx11::string::find((char *)ppbVar1,0x15b8aa);
            std::__cxx11::string::substr((ulong)local_668,(ulong)ppbVar1);
            std::__cxx11::string::operator=
                      ((string *)
                       &values.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,local_668);
            std::__cxx11::string::~string(local_668);
            lVar5 = std::__cxx11::string::length();
            lVar9 = std::__cxx11::string::length();
            if (lVar5 != lVar9 + 1) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_5c8,(value_type *)local_608);
              std::__cxx11::string::string(local_6b0,local_608);
              normalize_path(local_690,SUB81(local_6b0,0));
              std::__cxx11::string::~string(local_6b0);
              std::operator+((char *)local_6d0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "sound/");
              std::operator+((char *)local_6f0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "sprites/");
              std::__cxx11::string::string(local_718,(string *)local_690);
              bVar4 = is_default_file((string *)local_718);
              local_1282 = true;
              if (!bVar4) {
                local_1282 = contentExists(local_690,false,(string *)dummy_abi_cxx11_);
              }
              std::__cxx11::string::~string(local_718);
              local_6f1 = local_1282;
              std::__cxx11::string::string(local_740,local_6d0);
              bVar4 = is_default_file((string *)local_740);
              local_1286 = true;
              if (!bVar4) {
                local_1286 = contentExists((string *)local_6d0,false,(string *)dummy_abi_cxx11_);
              }
              std::__cxx11::string::~string(local_740);
              local_719 = local_1286;
              std::__cxx11::string::string(local_768,local_6f0);
              bVar4 = is_default_file((string *)local_768);
              local_128a = true;
              if (!bVar4) {
                local_128a = contentExists((string *)local_6f0,false,(string *)dummy_abi_cxx11_);
              }
              std::__cxx11::string::~string(local_768);
              local_741 = local_128a;
              sVar10 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_5c8);
              if ((((1 < sVar10) && ((local_6f1 & 1U) == 0)) && ((local_719 & 1U) == 0)) &&
                 ((local_741 & 1U) == 0)) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&i,"",&local_789);
                std::allocator<char>::~allocator((allocator<char> *)&local_789);
                for (local_790 = 0; uVar6 = (ulong)local_790,
                    sVar10 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_5c8), uVar6 < sVar10; local_790 = local_790 + 1) {
                  pvVar11 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)local_5c8,(long)local_790);
                  std::__cxx11::string::operator+=((string *)&i,(string *)pvVar11);
                }
                bVar4 = contentExists((string *)&i,false,(string *)dummy_abi_cxx11_);
                if (bVar4) {
                  std::__cxx11::string::operator=(local_608,(string *)&i);
                  std::__cxx11::string::string(local_7d0,local_608);
                  normalize_path(local_7b0,SUB81(local_7d0,0));
                  std::__cxx11::string::operator=((string *)local_690,(string *)local_7b0);
                  std::__cxx11::string::~string((string *)local_7b0);
                  std::__cxx11::string::~string(local_7d0);
                  std::operator+((char *)local_7f0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)"sound/");
                  std::__cxx11::string::operator=(local_6d0,local_7f0);
                  std::__cxx11::string::~string(local_7f0);
                  std::__cxx11::string::string(local_810,(string *)local_690);
                  bVar4 = is_default_file((string *)local_810);
                  local_12c2 = true;
                  if (!bVar4) {
                    local_12c2 = contentExists(local_690,false,(string *)dummy_abi_cxx11_);
                  }
                  local_6f1 = local_12c2;
                  std::__cxx11::string::~string(local_810);
                  std::__cxx11::string::string(local_830,local_6d0);
                  bVar4 = is_default_file((string *)local_830);
                  local_12c5 = true;
                  if (!bVar4) {
                    local_12c5 = contentExists((string *)local_6d0,false,(string *)dummy_abi_cxx11_)
                    ;
                  }
                  local_719 = local_12c5;
                  std::__cxx11::string::~string(local_830);
                  std::__cxx11::string::string(local_850,local_6f0);
                  bVar4 = is_default_file((string *)local_850);
                  local_12c8 = true;
                  if (!bVar4) {
                    local_12c8 = contentExists((string *)local_6f0,false,(string *)dummy_abi_cxx11_)
                    ;
                  }
                  local_741 = local_12c8;
                  std::__cxx11::string::~string(local_850);
                }
                std::__cxx11::string::~string((string *)&i);
              }
              bVar4 = std::operator==(local_628,"mdl");
              if (bVar4) {
                std::__cxx11::string::string(local_890,local_608);
                normalize_path(local_870,SUB81(local_890,0));
                std::__cxx11::string::string(local_8b0,local_110);
                add_model_resources(local_870,__return_storage_ptr__,(string *)local_8b0);
                std::__cxx11::string::~string(local_8b0);
                std::__cxx11::string::~string((string *)local_870);
                std::__cxx11::string::~string(local_890);
              }
              else {
                bVar4 = std::operator==(local_628,"spr");
                if (bVar4) {
                  if ((local_741 & 1U) == 0) {
                    local_12d8 = local_608;
                  }
                  else {
                    local_12d8 = local_6f0;
                  }
                  std::__cxx11::string::string(local_8d0,local_12d8);
                  std::__cxx11::string::string(local_910,local_8d0);
                  normalize_path(local_8f0,SUB81(local_910,0));
                  std::__cxx11::string::operator=(local_608,(string *)local_8f0);
                  std::__cxx11::string::~string((string *)local_8f0);
                  std::__cxx11::string::~string(local_910);
                  std::__cxx11::string::string(local_930,local_608);
                  std::__cxx11::string::string(local_950,local_110);
                  trace_missing_file((string *)local_930,(string *)local_950,true);
                  std::__cxx11::string::~string(local_950);
                  std::__cxx11::string::~string(local_930);
                  std::__cxx11::string::string(local_970,local_608);
                  push_unique(__return_storage_ptr__,(string *)local_970);
                  std::__cxx11::string::~string(local_970);
                  std::__cxx11::string::~string(local_8d0);
                }
                else {
                  if ((local_719 & 1U) == 0) {
                    local_12f0 = local_608;
                  }
                  else {
                    local_12f0 = local_6d0;
                  }
                  std::__cxx11::string::string(local_990,local_12f0);
                  std::__cxx11::string::string(local_9d0,local_990);
                  normalize_path(local_9b0,SUB81(local_9d0,0));
                  std::__cxx11::string::operator=(local_608,(string *)local_9b0);
                  std::__cxx11::string::~string((string *)local_9b0);
                  std::__cxx11::string::~string(local_9d0);
                  for (local_9d4 = 0; local_9d4 < 0x16; local_9d4 = local_9d4 + 1) {
                    bVar4 = std::operator==(local_628,g_valid_exts[local_9d4]);
                    if (bVar4) {
                      std::__cxx11::string::string(local_9f8,local_608);
                      std::__cxx11::string::string(local_a18,local_110);
                      trace_missing_file((string *)local_9f8,(string *)local_a18,true);
                      std::__cxx11::string::~string(local_a18);
                      std::__cxx11::string::~string(local_9f8);
                      std::__cxx11::string::string(local_a38,local_608);
                      push_unique(__return_storage_ptr__,(string *)local_a38);
                      std::__cxx11::string::~string(local_a38);
                      break;
                    }
                  }
                  std::__cxx11::string::~string(local_990);
                }
              }
              std::__cxx11::string::~string(local_6f0);
              std::__cxx11::string::~string(local_6d0);
              std::__cxx11::string::~string((string *)local_690);
            }
            std::__cxx11::string::~string((string *)local_628);
            std::__cxx11::string::~string(local_608);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_5c8);
          std::__cxx11::string::~string
                    ((string *)
                     &values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        if (((local_65 & 1) == 0) &&
           (lVar5 = std::__cxx11::string::find((char *)local_340,0x15c76b), lVar5 != -1)) {
          std::operator+((char *)local_ab8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "ERROR: Failed to parse custom weapon definition in ");
          std::operator+(local_a98,(char *)local_ab8);
          std::__cxx11::to_string(local_ad8,local_31c);
          std::operator+(local_a78,local_a98);
          std::operator+(local_a58,(char *)local_a78);
          std::__cxx11::string::~string((string *)local_a78);
          std::__cxx11::string::~string((string *)local_ad8);
          std::__cxx11::string::~string((string *)local_a98);
          std::__cxx11::string::~string(local_ab8);
          std::__cxx11::string::find((char *)local_340,0x15c76b);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&comma,"g_ItemRegistry.RegisterWeapon(",&local_b19)
          ;
          std::__cxx11::string::length();
          std::__cxx11::string::substr((ulong)local_af8,(ulong)local_340);
          std::__cxx11::string::operator=(local_340,local_af8);
          std::__cxx11::string::~string(local_af8);
          std::__cxx11::string::~string((string *)&comma);
          std::allocator<char>::~allocator((allocator<char> *)&local_b19);
          local_b20 = std::__cxx11::string::find_first_of((char *)local_340,0x15c590);
          uVar6 = (ulong)local_b20;
          lVar5 = std::__cxx11::string::length();
          if (uVar6 < lVar5 - 1U) {
            std::__cxx11::string::substr((ulong)local_b80,(ulong)local_340);
            trimSpaces(local_b60);
            std::__cxx11::string::~string(local_b80);
            std::__cxx11::string::substr((ulong)local_ba0,(ulong)local_340);
            std::__cxx11::string::operator=(local_340,local_ba0);
            std::__cxx11::string::~string(local_ba0);
            local_ba4 = std::__cxx11::string::find_first_of((char *)local_340,0x15c590);
            if (local_ba4 == -1) {
              local_ba4 = std::__cxx11::string::find_last_of((char *)local_340,0x15bd4e);
            }
            uVar6 = (ulong)local_ba4;
            lVar5 = std::__cxx11::string::length();
            if (uVar6 < lVar5 - 1U) {
              std::__cxx11::string::substr
                        ((ulong)&ret1.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_340
                        );
              trimSpaces(local_be8);
              std::__cxx11::string::~string
                        ((string *)
                         &ret1.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::__cxx11::string::string(local_c40,(string *)local_b60);
              std::__cxx11::string::string(local_c60,(string *)fname);
              std::__cxx11::string::string
                        ((string *)
                         &ret2.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_a58);
              parse_script_arg((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_c20,(string *)local_c40,(string *)local_c60,
                               (string *)
                               &ret2.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::__cxx11::string::~string
                        ((string *)
                         &ret2.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::__cxx11::string::~string(local_c60);
              std::__cxx11::string::~string(local_c40);
              std::__cxx11::string::string(local_cb8,(string *)local_be8);
              std::__cxx11::string::string(local_cd8,(string *)fname);
              std::__cxx11::string::string(local_cf8,(string *)local_a58);
              parse_script_arg((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_c98,(string *)local_cb8,(string *)local_cd8,
                               (string *)local_cf8);
              std::__cxx11::string::~string(local_cf8);
              std::__cxx11::string::~string(local_cd8);
              std::__cxx11::string::~string(local_cb8);
              sVar10 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_c20);
              if ((sVar10 != 0) &&
                 (sVar10 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_c98), sVar10 != 0)) {
                sVar10 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_c20);
                if ((sVar10 < 2) &&
                   (sVar10 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_c98), sVar10 < 2)) {
                  pvVar11 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)local_c20,0);
                  std::__cxx11::string::operator=((string *)local_b60,(string *)pvVar11);
                  pvVar11 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)local_c98,0);
                  std::__cxx11::string::operator=((string *)local_be8,(string *)pvVar11);
                  std::operator+((char *)local_d98,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)"sprites/");
                  std::operator+(local_d78,(char *)local_d98);
                  std::operator+(local_d58,local_d78);
                  std::operator+(local_d38,(char *)local_d58);
                  std::__cxx11::string::~string((string *)local_d58);
                  std::__cxx11::string::~string((string *)local_d78);
                  std::__cxx11::string::~string(local_d98);
                  std::__cxx11::string::string(local_db8,(string *)local_d38);
                  std::__cxx11::string::string(local_dd8,local_110);
                  trace_missing_file((string *)local_db8,(string *)local_dd8,true);
                  std::__cxx11::string::~string(local_dd8);
                  std::__cxx11::string::~string(local_db8);
                  std::__cxx11::string::string(local_df8,(string *)local_d38);
                  push_unique(hud_files,(string *)local_df8);
                  std::__cxx11::string::~string(local_df8);
                  std::__cxx11::string::string(local_e18,(string *)local_d38);
                  bVar4 = contentExists((string *)local_e18,true,(string *)dummy_abi_cxx11_);
                  if (bVar4) {
                    std::ifstream::ifstream(local_1020,local_e18,_S_in);
                    bVar3 = std::ifstream::is_open();
                    if ((bVar3 & 1) != 0) {
                      std::__cxx11::string::string((string *)&cpos);
                      while( true ) {
                        piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                           (local_1020,(string *)&cpos);
                        bVar4 = std::ios::operator_cast_to_bool
                                          ((ios *)(piVar8 + *(long *)(*(long *)piVar8 + -0x18)));
                        if (!bVar4) break;
                        local_1050 = std::__cxx11::string::find((char *)&cpos,0x15b1fa);
                        if (local_1050 != -1) {
                          std::__cxx11::string::substr((ulong)local_1070,(ulong)&cpos);
                          std::__cxx11::string::operator=((string *)&cpos,local_1070);
                          std::__cxx11::string::~string(local_1070);
                        }
                        std::__cxx11::string::string(local_10b0,(string *)&cpos);
                        trimSpaces(local_1090);
                        std::__cxx11::string::operator=((string *)&cpos,(string *)local_1090);
                        std::__cxx11::string::~string((string *)local_1090);
                        std::__cxx11::string::~string(local_10b0);
                        std::__cxx11::string::string
                                  ((string *)
                                   &parts.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (string *)&cpos);
                        replaceChar(local_10d0,(char)&parts + '\x10','\t');
                        std::__cxx11::string::operator=((string *)&cpos,(string *)local_10d0);
                        std::__cxx11::string::~string((string *)local_10d0);
                        std::__cxx11::string::~string
                                  ((string *)
                                   &parts.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        std::__cxx11::string::string(local_1128,(string *)&cpos);
                        splitString((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_1108,(string *)local_1128," ");
                        std::__cxx11::string::~string(local_1128);
                        sVar10 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)local_1108);
                        if (2 < sVar10) {
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_1108,2);
                          std::operator+((char *)local_1168,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)"sprites/");
                          std::operator+(local_1148,(char *)local_1168);
                          std::__cxx11::string::~string(local_1168);
                          std::__cxx11::string::string(local_1188,(string *)local_1148);
                          std::operator+(local_11c8,(char *)local_110);
                          std::operator+(local_11a8,local_11c8);
                          trace_missing_file((string *)local_1188,local_11a8,true);
                          std::__cxx11::string::~string((string *)local_11a8);
                          std::__cxx11::string::~string((string *)local_11c8);
                          std::__cxx11::string::~string(local_1188);
                          std::__cxx11::string::string(local_11e8,(string *)local_1148);
                          push_unique(__return_storage_ptr__,(string *)local_11e8);
                          std::__cxx11::string::~string(local_11e8);
                          std::__cxx11::string::~string((string *)local_1148);
                        }
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_1108);
                      }
                      std::__cxx11::string::~string((string *)&cpos);
                    }
                    std::ifstream::close();
                    std::ifstream::~ifstream(local_1020);
                  }
                  std::__cxx11::string::~string(local_e18);
                  std::__cxx11::string::~string((string *)local_d38);
                }
                else {
                  dVar12 = (double)std::operator+(local_d18,(char *)local_a58);
                  log(dVar12);
                  std::__cxx11::string::~string((string *)local_d18);
                }
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_c98);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_c20);
              std::__cxx11::string::~string((string *)local_be8);
            }
            else {
              dVar12 = (double)std::operator+(local_bc8,(char *)local_a58);
              log(dVar12);
              std::__cxx11::string::~string((string *)local_bc8);
            }
            std::__cxx11::string::~string((string *)local_b60);
          }
          else {
            dVar12 = (double)std::operator+(local_b40,(char *)local_a58);
            log(dVar12);
            std::__cxx11::string::~string((string *)local_b40);
          }
          std::__cxx11::string::~string((string *)local_a58);
        }
      }
    } while( true );
  }
LAB_00154950:
  std::ifstream::close();
  std::ifstream::~ifstream(local_318);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_50);
  return __return_storage_ptr__;
LAB_00154934:
  std::__cxx11::string::~string(local_340);
  goto LAB_00154950;
}

Assistant:

set_icase get_script_dependencies(string fname, set<string>& searchedScripts, set_icase& hud_files)
{
	set_icase resources;

	string folder = "scripts/maps/";

	// ignore sounds/models in this script. They're false positives.
	bool isWeaponCustom = toLowerCase(fname).find("weapon_custom.as") != string::npos;

	int idir = fname.find_last_of("/\\");
	if (idir != string::npos && idir > folder.length())
		folder = fname.substr(0, idir) + '/';

	contentExists(fname, true); // fix caps

	string trace = fname;

	ifstream myfile(fname);
	if (myfile.is_open())
	{
		int lineNum = 0;
		bool inCommentBlock = false;
		string line;
		while (getline(myfile, line))
		{
			lineNum++;

			line = trimSpaces(line);
			if (line.find("//") == 0)
				continue;
			
			// check for block comments
			{	
				size_t commentStart = line.find("/*");
				size_t commentEnd = line.find("*/");

				// remove inline block comments
				while (commentStart != string::npos && commentEnd != string::npos)
				{
					line = line.substr(0, commentStart) + line.substr(commentEnd+2);
					commentStart = line.find("/*");
					commentEnd = line.find("*/");
				}

				// ignore lines contained in comment blocks
				if (inCommentBlock)
				{
					if (commentEnd != string::npos)
					{
						inCommentBlock = false;
						line = line.substr(commentEnd+2);
						commentStart = commentEnd = string::npos;
					}
					else
						continue;
				}				
				else if (commentStart != string::npos)
				{
					line = line.substr(0, commentStart);
					inCommentBlock = true;
				}
			}

			line = replaceChar(line, '\t', ' ' );
			
			if (line.find("#include") == 0) 
			{
				// .as extension is optional in cfg file, but required to be ommitted in #include statements
				string include = normalize_path(folder + readQuote(line) + ".as");
				if (searchedScripts.find(include) == searchedScripts.end())
				{
					searchedScripts.insert(include);
					push_unique(resources, include);
					set_icase includeRes = get_script_dependencies(include, searchedScripts, hud_files);
					resources.insert(includeRes.begin(), includeRes.end());
				}
			}

			// look for string literals
			if (!isWeaponCustom) {
				string s = line;
				vector<string> values;
				while (s.length())
				{
					if (s.find("\"") >= s.length() - 1)
						break;
					s = s.substr(s.find("\"") + 1);

					if (s.find("\"") == string::npos)
						break;

					string val = s.substr(0, s.find("\""));
					string ext = get_ext(val);

					s = s.substr(s.find("\"")+1);	

					if (val.length() == ext.length() + 1)
						continue; // probably a path constructed from vars

					values.push_back(val);

					// handle case where the full path is broken up into separate string literals for no reason
					string tmpVal = normalize_path(val);
					string sound_val = "sound/" + tmpVal;
					string sprite_val = "sprites/" + tmpVal;
					bool valExists = is_default_file(tmpVal) || contentExists(tmpVal, false);
					bool soundValExists = is_default_file(sound_val) || contentExists(sound_val, false);
					bool spriteValExists = is_default_file(sprite_val) || contentExists(sprite_val, false);
					if (values.size() > 1 && !valExists && !soundValExists && !spriteValExists)
					{
						string concatVal = "";
						for (int i = 0; i < values.size(); i++)
							concatVal += values[i];
						if (contentExists(concatVal, false))
						{
							val = concatVal;
							
							tmpVal = normalize_path(val);
							sound_val = "sound/" + tmpVal;
							valExists = is_default_file(tmpVal) || contentExists(tmpVal, false);
							soundValExists = is_default_file(sound_val) || contentExists(sound_val, false);
							spriteValExists = is_default_file(sprite_val) || contentExists(sprite_val, false);
						}
					}

					if (ext == "mdl")
					{
						add_model_resources(normalize_path(val), resources, trace);
					}
					else if (ext == "spr")
					{
						// sprites/ prefix is optional for HUD parameters
						string valpath = spriteValExists ? sprite_val : val;

						val = normalize_path(valpath);
						trace_missing_file(val, trace, true);
						push_unique(resources, val);
					}
					else
					{
						// probably safe to assume the script is using sounds correctly,
						// so it's ok if the prefix is missing. Just try to find a plausible match.
						// There will be too many false positives otherwise.
						string valpath = soundValExists ? sound_val : val;
						
						val = normalize_path(valpath);
						for (int k = 0; k < NUM_SOUND_EXTS; k++)
						{
							if (ext == g_valid_exts[k])
							{
								trace_missing_file(val, trace, true);
								push_unique(resources, val);
								break;
							}
						}
					}
				}
				
			}

			// try to parse out custom weapon sprite files
			if (!isWeaponCustom && line.find("g_ItemRegistry.RegisterWeapon(") != string::npos)
			{
				string err = "ERROR: Failed to parse custom weapon definition in " + fname + " (line " + to_string(lineNum) + ")\n";
				line = line.substr(line.find("g_ItemRegistry.RegisterWeapon(") + string("g_ItemRegistry.RegisterWeapon(").length());
				int comma = line.find_first_of(",");
				if (comma >= line.length()-1)
				{
					log(err + "\t Reason: couldn't find all arguments on this line\n");
					continue;
				}
				string arg1 = trimSpaces(line.substr(0, comma));

				line = line.substr(comma+1);
				int comma2 = line.find_first_of(",");
				if (comma2 == string::npos)
					comma2 = line.find_last_of(")"); // third arg is optional
				if (comma2 >= line.length()-1)
				{
					log(err + "\t Reason: couldn't find all arguments on this line\n");
					continue;
				}
				string arg2 = trimSpaces(line.substr(0, comma2));

				vector<string> ret1 = parse_script_arg(arg1, fname, err);
				vector<string> ret2 = parse_script_arg(arg2, fname, err);

				if (ret1.size() == 0 || ret2.size() == 0)
					continue;

				if (ret1.size() > 1 || ret2.size() > 1)
				{
					log(err + "\t Reason: array argument(s) with variable index not handled\n");
					continue;
				}

				arg1 = ret1[0];
				arg2 = ret2[0];

				// Note: code duplicated in Bsp.cpp (weapon_custom)
				string hud_file = "sprites/" + arg2 + "/" + arg1 + ".txt";
				trace_missing_file(hud_file, trace, true);
				push_unique(hud_files, hud_file);

				string hud_path = hud_file;
				if (contentExists(hud_path, true))
				{
					ifstream file(hud_path);
					if (file.is_open())
					{
						int lineNum = 0;
						bool in_func_body = false;
						string line;
						while (getline(file, line))
						{
							lineNum++;

							// strip comments
							size_t cpos = line.find("//");
							if (cpos != string::npos)
								line = line.substr(0, cpos);

							line = trimSpaces(line);

							line = replaceChar(line, '\t', ' ');
							vector<string> parts = splitString(line, " ");

							if (parts.size() < 3)
								continue;
							
							string spr = "sprites/" + parts[2] + ".spr";
							trace_missing_file(spr, trace + " --> " + hud_file, true);
							push_unique(resources, spr);
						}
					}
					file.close();
				}
			}
		}
	}
	//else
	//	cout << "Failed to open: " << fname << endl; // not needed - file will be flagged as missing later
	myfile.close();

	return resources;
}